

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshints.c
# Opt level: O0

void cf2_glyphpath_init(CF2_GlyphPath glyphpath,CF2_Font font,CF2_OutlineCallbacks callbacks,
                       CF2_F16Dot16 scaleY,CF2_ArrStack hStemHintArray,CF2_ArrStack vStemHintArray,
                       CF2_HintMask hintMask,CF2_F16Dot16 hintOriginY,CF2_Blues blues,
                       FT_Vector *fractionalTranslation)

{
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_3c;
  CF2_ArrStack vStemHintArray_local;
  CF2_ArrStack hStemHintArray_local;
  CF2_F16Dot16 scaleY_local;
  CF2_OutlineCallbacks callbacks_local;
  CF2_Font font_local;
  CF2_GlyphPath glyphpath_local;
  
  memset(glyphpath,0,0x49b8);
  glyphpath->font = font;
  glyphpath->callbacks = callbacks;
  cf2_arrstack_init(&glyphpath->hintMoves,font->memory,&font->error,0x10);
  cf2_hintmap_init(&glyphpath->initialHintMap,font,&glyphpath->initialHintMap,&glyphpath->hintMoves,
                   scaleY);
  cf2_hintmap_init(&glyphpath->firstHintMap,font,&glyphpath->initialHintMap,&glyphpath->hintMoves,
                   scaleY);
  cf2_hintmap_init(&glyphpath->hintMap,font,&glyphpath->initialHintMap,&glyphpath->hintMoves,scaleY)
  ;
  glyphpath->scaleX = (font->innerTransform).a;
  glyphpath->scaleC = (font->innerTransform).c;
  glyphpath->scaleY = (font->innerTransform).d;
  (glyphpath->fractionalTranslation).x = fractionalTranslation->x;
  (glyphpath->fractionalTranslation).y = fractionalTranslation->y;
  glyphpath->hStemHintArray = hStemHintArray;
  glyphpath->vStemHintArray = vStemHintArray;
  glyphpath->hintMask = hintMask;
  glyphpath->hintOriginY = hintOriginY;
  glyphpath->blues = blues;
  glyphpath->darken = font->darkened;
  glyphpath->xOffset = font->darkenX;
  glyphpath->yOffset = font->darkenY;
  if (glyphpath->xOffset < 0) {
    local_3c = -glyphpath->xOffset;
  }
  else {
    local_3c = glyphpath->xOffset;
  }
  if (glyphpath->yOffset < 0) {
    local_44 = -glyphpath->yOffset;
  }
  else {
    local_44 = glyphpath->yOffset;
  }
  if (local_44 < local_3c) {
    if (glyphpath->xOffset < 0) {
      local_48 = -glyphpath->xOffset;
    }
    else {
      local_48 = glyphpath->xOffset;
    }
    local_4c = local_48;
  }
  else {
    if (glyphpath->yOffset < 0) {
      local_50 = -glyphpath->yOffset;
    }
    else {
      local_50 = glyphpath->yOffset;
    }
    local_4c = local_50;
  }
  glyphpath->miterLimit = local_4c << 1;
  glyphpath->snapThreshold = 0x199a;
  glyphpath->moveIsPending = '\x01';
  glyphpath->pathIsOpen = '\0';
  glyphpath->pathIsClosing = '\0';
  glyphpath->elemIsQueued = '\0';
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  cf2_glyphpath_init( CF2_GlyphPath         glyphpath,
                      CF2_Font              font,
                      CF2_OutlineCallbacks  callbacks,
                      CF2_Fixed             scaleY,
                      /* CF2_Fixed  hShift, */
                      CF2_ArrStack          hStemHintArray,
                      CF2_ArrStack          vStemHintArray,
                      CF2_HintMask          hintMask,
                      CF2_Fixed             hintOriginY,
                      const CF2_Blues       blues,
                      const FT_Vector*      fractionalTranslation )
  {
    FT_ZERO( glyphpath );

    glyphpath->font      = font;
    glyphpath->callbacks = callbacks;

    cf2_arrstack_init( &glyphpath->hintMoves,
                       font->memory,
                       &font->error,
                       sizeof ( CF2_HintMoveRec ) );

    cf2_hintmap_init( &glyphpath->initialHintMap,
                      font,
                      &glyphpath->initialHintMap,
                      &glyphpath->hintMoves,
                      scaleY );
    cf2_hintmap_init( &glyphpath->firstHintMap,
                      font,
                      &glyphpath->initialHintMap,
                      &glyphpath->hintMoves,
                      scaleY );
    cf2_hintmap_init( &glyphpath->hintMap,
                      font,
                      &glyphpath->initialHintMap,
                      &glyphpath->hintMoves,
                      scaleY );

    glyphpath->scaleX = font->innerTransform.a;
    glyphpath->scaleC = font->innerTransform.c;
    glyphpath->scaleY = font->innerTransform.d;

    glyphpath->fractionalTranslation = *fractionalTranslation;

#if 0
    glyphpath->hShift = hShift;       /* for fauxing */
#endif

    glyphpath->hStemHintArray = hStemHintArray;
    glyphpath->vStemHintArray = vStemHintArray;
    glyphpath->hintMask       = hintMask;      /* ptr to current mask */
    glyphpath->hintOriginY    = hintOriginY;
    glyphpath->blues          = blues;
    glyphpath->darken         = font->darkened; /* TODO: should we make copies? */
    glyphpath->xOffset        = font->darkenX;
    glyphpath->yOffset        = font->darkenY;
    glyphpath->miterLimit     = 2 * FT_MAX(
                                     cf2_fixedAbs( glyphpath->xOffset ),
                                     cf2_fixedAbs( glyphpath->yOffset ) );

    /* .1 character space unit */
    glyphpath->snapThreshold = cf2_doubleToFixed( 0.1 );

    glyphpath->moveIsPending = TRUE;
    glyphpath->pathIsOpen    = FALSE;
    glyphpath->pathIsClosing = FALSE;
    glyphpath->elemIsQueued  = FALSE;
  }